

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_spec.cpp
# Opt level: O3

void parseHEXFile(filebuf *file)

{
  pointer paVar1;
  _Alloc_hider _Var2;
  uint8_t uVar3;
  uint8_t uVar4;
  uint8_t uVar5;
  uint8_t uVar6;
  uint8_t uVar7;
  uint8_t uVar8;
  uint uVar9;
  void *pvVar10;
  uint uVar11;
  ushort uVar12;
  char cVar13;
  long lVar14;
  string line;
  ushort local_64;
  string local_60;
  filebuf *local_40;
  vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_> *local_38;
  
  uVar11 = (uint)options.nbPalettes;
  uVar9 = (uint)options.nbColorsPerPal;
  local_38 = &options.palSpec;
  uVar12 = 0;
  local_40 = file;
  do {
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    readLine(file,&local_60);
    _Var2._M_p = local_60._M_dataplus._M_p;
    local_64 = (ushort)(uVar11 * uVar9);
    if (local_60._M_string_length == 0) {
      cVar13 = '\x02';
    }
    else if (local_60._M_string_length == 6) {
      lVar14 = 1;
      do {
        pvVar10 = memchr("0123456789ABCDEFabcdef",(int)_Var2._M_p[lVar14 + -1],0x16);
        if (pvVar10 == (void *)0x0) {
          if (lVar14 != 0) goto LAB_0010cb3f;
          break;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != 7);
      cVar13 = _Var2._M_p[1];
      uVar3 = nibble(*_Var2._M_p);
      uVar4 = nibble(cVar13);
      cVar13 = local_60._M_dataplus._M_p[3];
      uVar5 = nibble(local_60._M_dataplus._M_p[2]);
      uVar6 = nibble(cVar13);
      cVar13 = local_60._M_dataplus._M_p[5];
      uVar7 = nibble(local_60._M_dataplus._M_p[4]);
      uVar8 = nibble(cVar13);
      uVar12 = uVar12 + 1;
      if (uVar12 < local_64) {
        if ((ushort)(uVar12 % (ushort)options.nbColorsPerPal) == 1) {
          if (options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_finish ==
              options.palSpec.
              super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>::
            _M_realloc_insert<>(local_38,(iterator)
                                         options.palSpec.
                                         super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish);
          }
          else {
            paVar1 = options.palSpec.
                     super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
            paVar1->_M_elems[0].red = '\0';
            paVar1->_M_elems[0].green = '\0';
            paVar1->_M_elems[0].blue = '\0';
            paVar1->_M_elems[0].alpha = '\0';
            paVar1->_M_elems[1].red = '\0';
            paVar1->_M_elems[1].green = '\0';
            paVar1->_M_elems[1].blue = '\0';
            paVar1->_M_elems[1].alpha = '\0';
            paVar1->_M_elems[2].red = '\0';
            paVar1->_M_elems[2].green = '\0';
            paVar1->_M_elems[2].blue = '\0';
            paVar1->_M_elems[2].alpha = '\0';
            paVar1->_M_elems[3].red = '\0';
            paVar1->_M_elems[3].green = '\0';
            paVar1->_M_elems[3].blue = '\0';
            paVar1->_M_elems[3].alpha = '\0';
            options.palSpec.
            super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
            _M_impl.super__Vector_impl_data._M_finish =
                 options.palSpec.
                 super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish + 1;
          }
        }
        options.palSpec.
        super__Vector_base<std::array<Rgba,_4UL>,_std::allocator<std::array<Rgba,_4UL>_>_>._M_impl.
        super__Vector_impl_data._M_finish[-1]._M_elems
        [(ushort)(uVar12 % (ushort)options.nbColorsPerPal)] =
             (Rgba)((uint)(byte)(uVar3 * '\x10' + uVar4) |
                    (uint)(byte)(uVar5 * '\x10' + uVar6) << 8 |
                    (uint)(byte)(uVar7 * '\x10' + uVar8) << 0x10 | 0xff000000);
      }
      cVar13 = '\0';
      file = local_40;
    }
    else {
LAB_0010cb3f:
      cVar13 = '\x01';
      error("Failed to parse color #%u (\"%s\"): invalid \"rrggbb\" line",(ulong)(uVar12 + 1),
            _Var2._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,
                      CONCAT71(local_60.field_2._M_allocated_capacity._1_7_,
                               local_60.field_2._M_local_buf[0]) + 1);
    }
    if (cVar13 != '\0') {
      if ((cVar13 == '\x02') && (local_64 < uVar12)) {
        warning("HEX file contains %u colors, but there can only be %u; ignoring extra",
                (ulong)uVar12,(ulong)(uVar11 * uVar9));
      }
      return;
    }
  } while( true );
}

Assistant:

static void parseHEXFile(std::filebuf &file) {
	// https://lospec.com/palette-list/tag/gbc

	uint16_t nbColors = 0;
	uint16_t maxNbColors = options.nbColorsPerPal * options.nbPalettes;

	for (;;) {
		std::string line;
		readLine(file, line);
		if (!line.length()) {
			break;
		}

		if (line.length() != 6
		    || line.find_first_not_of("0123456789ABCDEFabcdef"sv) != std::string::npos) {
			error("Failed to parse color #%" PRIu16 " (\"%s\"): invalid \"rrggbb\" line",
			      nbColors + 1, line.c_str());
			return;
		}

		Rgba color =
		    Rgba(toHex(line[0], line[1]), toHex(line[2], line[3]), toHex(line[4], line[5]), 0xFF);

		++nbColors;
		if (nbColors < maxNbColors) {
			if (nbColors % options.nbColorsPerPal == 1) {
				options.palSpec.emplace_back();
			}
			options.palSpec.back()[nbColors % options.nbColorsPerPal] = color;
		}
	}

	if (nbColors > maxNbColors) {
		warning("HEX file contains %" PRIu16 " colors, but there can only be %" PRIu16
		        "; ignoring extra",
		        nbColors, maxNbColors);
	}
}